

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

coda_expression *
coda_expression_new(coda_expression_node_type tag,char *string_value,coda_expression *op1,
                   coda_expression *op2,coda_expression *op3,coda_expression *op4)

{
  ulong uVar1;
  coda_expression_node_type cVar2;
  bool local_5e;
  bool local_5d;
  coda_expression_operation *expr;
  coda_expression *op4_local;
  coda_expression *op3_local;
  coda_expression *op2_local;
  coda_expression *op1_local;
  char *string_value_local;
  coda_expression *pcStack_10;
  coda_expression_node_type tag_local;
  
  switch(tag) {
  case expr_constant_boolean:
    pcStack_10 = boolean_constant_new(string_value);
    break;
  case expr_constant_float:
    pcStack_10 = float_constant_new(string_value);
    break;
  case expr_constant_integer:
    pcStack_10 = integer_constant_new(string_value);
    break;
  case expr_constant_rawstring:
    pcStack_10 = rawstring_constant_new(string_value);
    break;
  case expr_constant_string:
    pcStack_10 = string_constant_new(string_value);
    break;
  default:
    if (tag == expr_neg) {
      if (op1->tag == expr_constant_float) {
        uVar1._0_4_ = op1[1].tag;
        uVar1._4_4_ = op1[1].result_type;
        op1[1].tag = (int)(uVar1 ^ 0x8000000000000000);
        op1[1].result_type = (int)((uVar1 ^ 0x8000000000000000) >> 0x20);
        return op1;
      }
      if (op1->tag == expr_constant_integer) {
        *(long *)(op1 + 1) = -*(long *)(op1 + 1);
        return op1;
      }
    }
    pcStack_10 = (coda_expression *)malloc(0x38);
    if (pcStack_10 == (coda_expression *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x38,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0x188);
      if (string_value != (char *)0x0) {
        free(string_value);
      }
      if (op1 != (coda_expression *)0x0) {
        coda_expression_delete(op1);
      }
      if (op2 != (coda_expression *)0x0) {
        coda_expression_delete(op2);
      }
      if (op3 != (coda_expression *)0x0) {
        coda_expression_delete(op3);
      }
      if (op4 != (coda_expression *)0x0) {
        coda_expression_delete(op4);
      }
      pcStack_10 = (coda_expression *)0x0;
    }
    else {
      pcStack_10->tag = tag;
      *(char **)(pcStack_10 + 1) = string_value;
      *(coda_expression **)&pcStack_10[1].is_constant = op1;
      *(coda_expression **)(pcStack_10 + 2) = op2;
      *(coda_expression **)&pcStack_10[2].is_constant = op3;
      *(coda_expression **)(pcStack_10 + 3) = op4;
      switch(tag) {
      case expr_abs:
      case expr_neg:
        pcStack_10->result_type = op1->result_type;
        break;
      case expr_add:
      case expr_divide:
      case expr_max:
      case expr_min:
      case expr_modulo:
      case expr_multiply:
      case expr_subtract:
        if ((op1->result_type == coda_expression_float) ||
           (op2->result_type == coda_expression_float)) {
          pcStack_10->result_type = coda_expression_float;
        }
        else {
          pcStack_10->result_type = op1->result_type;
        }
        break;
      case expr_and:
      case expr_array_count:
      case expr_array_index:
      case expr_bit_offset:
      case expr_bit_size:
      case expr_byte_offset:
      case expr_byte_size:
      case expr_dim:
      case expr_file_size:
      case expr_index:
      case expr_index_var:
      case expr_integer:
      case expr_length:
      case expr_num_dims:
      case expr_num_elements:
      case expr_or:
      case expr_product_version:
      case expr_unbound_array_index:
      case expr_variable_index:
      case expr_variable_value:
        pcStack_10->result_type = coda_expression_integer;
        break;
      case expr_array_add:
      case expr_array_max:
      case expr_array_min:
      case expr_at:
      case expr_if:
      case expr_with:
        pcStack_10->result_type = op2->result_type;
        break;
      case expr_array_all:
      case expr_array_exists:
      case expr_equal:
      case expr_exists:
      case expr_greater_equal:
      case expr_greater:
      case expr_isinf:
      case expr_ismininf:
      case expr_isnan:
      case expr_isplusinf:
      case expr_less_equal:
      case expr_less:
      case expr_logical_and:
      case expr_logical_or:
      case expr_not_equal:
      case expr_not:
      case expr_variable_exists:
        pcStack_10->result_type = coda_expression_boolean;
        break;
      case expr_asciiline:
      case expr_goto_array_element:
      case expr_goto_attribute:
      case expr_goto_begin:
      case expr_goto_field:
      case expr_goto_here:
      case expr_goto_parent:
      case expr_goto_root:
        pcStack_10->result_type = coda_expression_node;
        break;
      case expr_bytes:
      case expr_filename:
      case expr_ltrim:
      case expr_product_class:
      case expr_product_format:
      case expr_product_type:
      case expr_rtrim:
      case expr_string:
      case expr_strtime:
      case expr_substr:
      case expr_trim:
        pcStack_10->result_type = coda_expression_string;
        break;
      case expr_ceil:
      case expr_float:
      case expr_floor:
      case expr_power:
      case expr_round:
      case expr_time:
        pcStack_10->result_type = coda_expression_float;
        break;
      case expr_constant_boolean:
      case expr_constant_float:
      case expr_constant_integer:
      case expr_constant_rawstring:
      case expr_constant_string:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x222,
                      "coda_expression *coda_expression_new(coda_expression_node_type, char *, coda_expression *, coda_expression *, coda_expression *, coda_expression *)"
                     );
      case expr_for:
      case expr_goto:
      case expr_sequence:
      case expr_variable_set:
        pcStack_10->result_type = coda_expression_void;
        break;
      case expr_regex:
        if (op3 == (coda_expression *)0x0) {
          pcStack_10->result_type = coda_expression_boolean;
        }
        else {
          pcStack_10->result_type = coda_expression_string;
        }
      }
      cVar2 = pcStack_10->tag;
      if (((cVar2 - expr_file_size < 2) || (cVar2 - expr_product_class < 4)) ||
         (cVar2 - expr_variable_index < 2 || cVar2 == expr_variable_value)) {
        pcStack_10->is_constant = 0;
      }
      else {
        local_5d = false;
        if ((((pcStack_10->result_type != coda_expression_node) &&
             ((op1 == (coda_expression *)0x0 || (local_5d = false, op1->is_constant != 0)))) &&
            ((op2 == (coda_expression *)0x0 || (local_5d = false, op2->is_constant != 0)))) &&
           ((op3 == (coda_expression *)0x0 || (local_5d = false, op3->is_constant != 0)))) {
          local_5e = true;
          if (op4 != (coda_expression *)0x0) {
            local_5e = op4->is_constant != 0;
          }
          local_5d = local_5e;
        }
        pcStack_10->is_constant = (uint)local_5d;
      }
      pcStack_10->recursion_depth = 0;
      if ((op1 != (coda_expression *)0x0) &&
         (pcStack_10->recursion_depth < op1->recursion_depth + 1)) {
        pcStack_10->recursion_depth = op1->recursion_depth + 1;
      }
      if ((op2 != (coda_expression *)0x0) &&
         (pcStack_10->recursion_depth < op2->recursion_depth + 1)) {
        pcStack_10->recursion_depth = op2->recursion_depth + 1;
      }
      if ((op3 != (coda_expression *)0x0) &&
         (pcStack_10->recursion_depth < op3->recursion_depth + 1)) {
        pcStack_10->recursion_depth = op3->recursion_depth + 1;
      }
      if ((op4 != (coda_expression *)0x0) &&
         (pcStack_10->recursion_depth < op4->recursion_depth + 1)) {
        pcStack_10->recursion_depth = op4->recursion_depth + 1;
      }
      if (10000 < pcStack_10->recursion_depth) {
        coda_set_error(-0x191,"maximum recursion depth (%ld) reached",10000);
        coda_expression_delete(pcStack_10);
        pcStack_10 = (coda_expression *)0x0;
      }
    }
  }
  return pcStack_10;
}

Assistant:

coda_expression *coda_expression_new(coda_expression_node_type tag, char *string_value, coda_expression *op1,
                                     coda_expression *op2, coda_expression *op3, coda_expression *op4)
{
    coda_expression_operation *expr;

    switch (tag)
    {
        case expr_constant_boolean:
            return boolean_constant_new(string_value);
        case expr_constant_float:
            return float_constant_new(string_value);
        case expr_constant_integer:
            return integer_constant_new(string_value);
        case expr_constant_rawstring:
            return rawstring_constant_new(string_value);
        case expr_constant_string:
            return string_constant_new(string_value);
        default:
            break;
    }

    if (tag == expr_neg)
    {
        /* turn constant numbers into negative constant values */
        if (op1->tag == expr_constant_float)
        {
            ((coda_expression_float_constant *)op1)->value = -((coda_expression_float_constant *)op1)->value;
            return op1;
        }
        if (op1->tag == expr_constant_integer)
        {
            ((coda_expression_integer_constant *)op1)->value = -((coda_expression_integer_constant *)op1)->value;
            return op1;
        }
    }

    expr = malloc(sizeof(coda_expression_operation));
    if (expr == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_expression_operation), __FILE__, __LINE__);
        if (string_value != NULL)
        {
            free(string_value);
        }
        if (op1 != NULL)
        {
            coda_expression_delete(op1);
        }
        if (op2 != NULL)
        {
            coda_expression_delete(op2);
        }
        if (op3 != NULL)
        {
            coda_expression_delete(op3);
        }
        if (op4 != NULL)
        {
            coda_expression_delete(op4);
        }
        return NULL;
    }
    expr->tag = tag;
    expr->identifier = string_value;
    expr->operand[0] = op1;
    expr->operand[1] = op2;
    expr->operand[2] = op3;
    expr->operand[3] = op4;

    switch (tag)
    {
        case expr_array_all:
        case expr_array_exists:
        case expr_equal:
        case expr_exists:
        case expr_greater_equal:
        case expr_greater:
        case expr_isinf:
        case expr_ismininf:
        case expr_isnan:
        case expr_isplusinf:
        case expr_less_equal:
        case expr_less:
        case expr_logical_and:
        case expr_logical_or:
        case expr_not_equal:
        case expr_not:
        case expr_variable_exists:
            expr->result_type = coda_expression_boolean;
            break;
        case expr_power:
        case expr_ceil:
        case expr_float:
        case expr_floor:
        case expr_round:
        case expr_time:
            expr->result_type = coda_expression_float;
            break;
        case expr_and:
        case expr_array_count:
        case expr_array_index:
        case expr_bit_offset:
        case expr_bit_size:
        case expr_byte_offset:
        case expr_byte_size:
        case expr_dim:
        case expr_file_size:
        case expr_index:
        case expr_index_var:
        case expr_integer:
        case expr_length:
        case expr_num_dims:
        case expr_num_elements:
        case expr_or:
        case expr_product_version:
        case expr_unbound_array_index:
        case expr_variable_index:
        case expr_variable_value:
            expr->result_type = coda_expression_integer;
            break;
        case expr_bytes:
        case expr_filename:
        case expr_ltrim:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_rtrim:
        case expr_string:
        case expr_strtime:
        case expr_substr:
        case expr_trim:
            expr->result_type = coda_expression_string;
            break;
        case expr_for:
        case expr_goto:
        case expr_sequence:
        case expr_variable_set:
            expr->result_type = coda_expression_void;
            break;
        case expr_asciiline:
        case expr_goto_array_element:
        case expr_goto_attribute:
        case expr_goto_begin:
        case expr_goto_field:
        case expr_goto_here:
        case expr_goto_parent:
        case expr_goto_root:
            expr->result_type = coda_expression_node;
            break;
        case expr_abs:
        case expr_neg:
            expr->result_type = op1->result_type;
            break;
        case expr_add:
        case expr_divide:
        case expr_max:
        case expr_min:
        case expr_modulo:
        case expr_multiply:
        case expr_subtract:
            if (op1->result_type == coda_expression_float || op2->result_type == coda_expression_float)
            {
                /* allow one of the arguments to be an integer */
                expr->result_type = coda_expression_float;
            }
            else
            {
                expr->result_type = op1->result_type;
            }
            break;
        case expr_array_add:
        case expr_array_max:
        case expr_array_min:
        case expr_at:
        case expr_if:
        case expr_with:
            expr->result_type = op2->result_type;
            break;
        case expr_regex:
            if (op3 == NULL)
            {
                expr->result_type = coda_expression_boolean;
            }
            else
            {
                expr->result_type = coda_expression_string;
            }
            break;
        case expr_constant_boolean:
        case expr_constant_float:
        case expr_constant_integer:
        case expr_constant_rawstring:
        case expr_constant_string:
            assert(0);
            exit(1);
    }

    switch (expr->tag)
    {
        case expr_file_size:
        case expr_filename:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_product_version:
        case expr_variable_index:
        case expr_variable_set:
        case expr_variable_value:
            expr->is_constant = 0;
            break;
        default:
            expr->is_constant = expr->result_type != coda_expression_node && (op1 == NULL || op1->is_constant) &&
                (op2 == NULL || op2->is_constant) && (op3 == NULL || op3->is_constant) &&
                (op4 == NULL || op4->is_constant);
    }

    expr->recursion_depth = 0;
    if (op1 != NULL)
    {
        if (op1->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op1->recursion_depth + 1;
        }
    }
    if (op2 != NULL)
    {
        if (op2->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op2->recursion_depth + 1;
        }
    }
    if (op3 != NULL)
    {
        if (op3->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op3->recursion_depth + 1;
        }
    }
    if (op4 != NULL)
    {
        if (op4->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op4->recursion_depth + 1;
        }
    }
    if (expr->recursion_depth > CODA_MAX_RECURSION_DEPTH)
    {
        coda_set_error(CODA_ERROR_EXPRESSION, "maximum recursion depth (%ld) reached", CODA_MAX_RECURSION_DEPTH);
        coda_expression_delete((coda_expression *)expr);
        return NULL;
    }

    return (coda_expression *)expr;
}